

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O1

pair<double,_unsigned_long> compute_entropy(uint32_t *input,size_t n)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  mapped_type *pmVar3;
  size_t sVar4;
  __node_base _Var5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [64];
  undefined1 extraout_var [56];
  undefined1 in_ZMM1 [64];
  undefined1 in_XMM2 [16];
  pair<double,_unsigned_long> pVar8;
  uint32_t num;
  unordered_map<unsigned_int,_unsigned_long,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
  freqs;
  uint32_t local_8c;
  undefined1 local_88 [16];
  double local_70;
  double local_68;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_60;
  
  auVar6 = in_ZMM1._0_16_;
  local_60._M_buckets = &local_60._M_single_bucket;
  local_60._M_bucket_count = 1;
  local_60._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_60._M_element_count = 0;
  local_60._M_rehash_policy._M_max_load_factor = 1.0;
  local_60._M_rehash_policy._M_next_resize = 0;
  local_60._M_single_bucket = (__node_base_ptr)0x0;
  if (n != 0) {
    sVar4 = 0;
    do {
      local_8c = input[sVar4];
      pmVar3 = std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_60,&local_8c);
      auVar6 = in_ZMM1._0_16_;
      *pmVar3 = *pmVar3 + 1;
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
  }
  if (local_60._M_before_begin._M_nxt == (_Hash_node_base *)0x0) {
    auVar6 = ZEXT816(0) << 0x40;
  }
  else {
    auVar6 = vcvtusi2sd_avx512f(auVar6,n);
    local_70 = auVar6._0_8_;
    auVar7 = ZEXT864(0) << 0x40;
    _Var5._M_nxt = local_60._M_before_begin._M_nxt;
    do {
      local_88 = auVar7._0_16_;
      auVar6 = vcvtusi2sd_avx512f(in_XMM2,_Var5._M_nxt[2]._M_nxt);
      local_68 = auVar6._0_8_ / local_70;
      auVar7._0_8_ = log2(local_68);
      auVar7._8_56_ = extraout_var;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_68;
      auVar6 = vfmadd231sd_fma(local_88,auVar7._0_16_,auVar6);
      auVar7 = ZEXT1664(auVar6);
      _Var5._M_nxt = (_Var5._M_nxt)->_M_nxt;
    } while (_Var5._M_nxt != (_Hash_node_base *)0x0);
  }
  sVar2 = local_60._M_element_count;
  auVar1._8_8_ = 0x8000000000000000;
  auVar1._0_8_ = 0x8000000000000000;
  local_88 = vxorpd_avx512vl(auVar6,auVar1);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_60);
  pVar8.second = sVar2;
  pVar8.first = (double)local_88._0_8_;
  return pVar8;
}

Assistant:

std::pair<double, size_t> compute_entropy(const uint32_t* input, size_t n)
{
    std::unordered_map<uint32_t, uint64_t> freqs;
    for (size_t i = 0; i < n; i++) {
        uint32_t num = input[i];
        freqs[num] += 1;
    }
    double H0 = 0.0;
    double nn = n;
    for (const auto& c : freqs) {
        double p = double(c.second) / nn;
        H0 += (p * log2(p));
    }
    return { -H0, freqs.size() };
}